

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
~vector(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
        *this)

{
  memory_resource *pmVar1;
  
  this->nStored = 0;
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }